

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::EntryConcat(RecyclableObject *function,CallInfo callInfo,...)

{
  Type *pTVar1;
  ScriptContext *pSVar2;
  ScriptContext *scriptContext;
  JavascriptLibrary *pJVar3;
  _func_int *p_Var4;
  code *pcVar5;
  long lVar6;
  bool bVar7;
  RecordOverflowPolicy RVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  BOOL BVar12;
  uint uVar13;
  uint32 uVar14;
  undefined4 uVar15;
  undefined4 *puVar16;
  Var pvVar17;
  JavascriptCopyOnAccessNativeIntArray *pJVar18;
  JavascriptArray *pJVar19;
  int64 iVar20;
  JavascriptNativeIntArray *pJVar21;
  JavascriptNativeFloatArray *fArray;
  TypeId *remoteTypeIds;
  double dVar22;
  ulong uVar23;
  int in_stack_00000010;
  undefined1 *puStack_c0;
  double local_b8 [3];
  CallInfo local_a0;
  CallInfo callInfo_local;
  undefined1 local_80 [8];
  JsReentLock jsReentLock;
  undefined1 local_58 [8];
  ArgumentReader args;
  RecordOverflowPolicy local_31;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  puStack_c0 = (undefined1 *)0xb82326;
  local_a0 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != local_a0._0_4_) {
    AssertCount = AssertCount + 1;
    puStack_c0 = (undefined1 *)0xb8233f;
    Throw::LogAssert();
    puStack_c0 = (undefined1 *)0xb8234f;
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    puStack_c0 = (undefined1 *)0xb82377;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xe0b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    RVar8.fOverflow = local_31.fOverflow;
    if (!bVar9) goto LAB_00b82cef;
    *puVar16 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_58 = (undefined1  [8])local_a0;
  puStack_c0 = (undefined1 *)0xb823a7;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_58,&local_a0);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_80 = (undefined1  [8])pSVar2->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_80)->noJsReentrancy;
  ((ThreadContext *)local_80)->noJsReentrancy = true;
  if (((ulong)local_a0 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    puStack_c0 = (undefined1 *)0xb823f6;
    Throw::LogAssert();
    puStack_c0 = (undefined1 *)0xb82406;
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    puStack_c0 = (undefined1 *)0xb8242e;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xe0f,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    RVar8.fOverflow = local_31.fOverflow;
    if (!bVar9) {
LAB_00b82cef:
      local_31.fOverflow = RVar8.fOverflow;
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar16 = 0;
  }
  if (((ulong)local_58 & 0xffffff) == 0) {
    puStack_c0 = &LAB_00b82d09;
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec42,L"Array.prototype.concat");
  }
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  puStack_c0 = (undefined1 *)0xb82476;
  ThreadContext::ProbeStackNoDispose
            (scriptContext->threadContext,(ulong)(local_58._0_4_ & 0xffffff) * 8 + 0xc00,
             scriptContext,(PVOID)0x0);
  lVar6 = -(ulong)((local_58._0_4_ & 0xffffff) * 8 + 0xf & 0xfffffff0);
  remoteTypeIds = (TypeId *)((long)local_b8 + lVar6);
  local_31.fOverflow = false;
  if (((ulong)local_58 & 0xffffff) == 0) {
    args.super_Arguments.Values = (Type)0x0;
    bVar9 = true;
    bVar7 = true;
    RVar8.fOverflow = false;
  }
  else {
    *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb824b8;
    jsReentLock._24_8_ = __tls_get_addr(&PTR_0155fe48);
    bVar7 = true;
    uVar23 = 0;
    args.super_Arguments.Values = (Type)0x0;
    bVar9 = true;
    RVar8.fOverflow = false;
    do {
      *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb824e5;
      pvVar17 = Arguments::operator[]((Arguments *)local_58,(int)uVar23);
      if (pvVar17 != (Var)0x0) {
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb824f5;
        bVar10 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar17);
        if (bVar10) {
          *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82501;
          pJVar18 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar17);
        }
        else {
          pJVar18 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
        }
        if (pJVar18 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
          *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82512;
          JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(pJVar18);
        }
      }
      *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb8251a;
      bVar10 = DynamicObject::IsAnyArray(pvVar17);
      if (bVar10) {
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82526;
        pJVar19 = FromAnyArray(pvVar17);
        if (bVar9) {
          *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82537;
          bVar10 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pJVar19);
          if (!bVar10) {
            *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82543;
            bVar10 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pJVar19);
            bVar7 = false;
            if (!bVar10) {
              bVar9 = false;
            }
          }
        }
        pTVar1 = &(pJVar19->super_ArrayObject).length;
        uVar13 = (uint)args.super_Arguments.Values;
        args.super_Arguments.Values = (Type)(ulong)(uVar13 + *pTVar1);
        if (CARRY4(uVar13,*pTVar1)) {
          RVar8.fOverflow = true;
        }
      }
      else {
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82596;
        bVar10 = JavascriptOperators::IsArray(pvVar17);
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb825a2;
        JsReentLock::MutateArrayObject((JsReentLock *)local_80);
        *(bool *)((long)local_80 + 0x108) = true;
        if (bVar10) {
          *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb825be;
          bVar9 = VarIs<Js::JavascriptProxy>(pvVar17);
          if (!bVar9) {
            bVar9 = ((pSVar2->config).threadConfig)->m_ES6ToLength;
            *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            if (bVar9 == true) {
              *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb825f4;
              pvVar17 = JavascriptOperators::OP_GetLength(pvVar17,pSVar2);
              *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82607;
              iVar20 = JavascriptConversion::ToLength(pvVar17,pSVar2);
              *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82613;
              JsReentLock::MutateArrayObject((JsReentLock *)local_80);
              *(bool *)((long)local_80 + 0x108) = true;
              if (0xfffffffe < iVar20) {
                iVar20 = 0xffffffff;
              }
              uVar13 = (uint)args.super_Arguments.Values;
              args.super_Arguments.Values = (Type)(ulong)(uVar13 + (uint)iVar20);
              if (CARRY4(uVar13,(uint)iVar20)) {
                RVar8.fOverflow = true;
              }
            }
            else {
              *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb8277f;
              pvVar17 = JavascriptOperators::OP_GetLength(pvVar17,pSVar2);
              if (((ulong)pvVar17 & 0x1ffff00000000) != 0x1000000000000 &&
                  ((ulong)pvVar17 & 0xffff000000000000) == 0x1000000000000) {
                AssertCount = AssertCount + 1;
                *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb827c0;
                Throw::LogAssert();
                *(undefined4 *)jsReentLock._24_8_ = 1;
                *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb827e9;
                bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                            ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                            "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar9) goto LAB_00b82cef;
                *(undefined4 *)jsReentLock._24_8_ = 0;
              }
              if (((ulong)pvVar17 & 0xffff000000000000) == 0x1000000000000) {
                if (((ulong)pvVar17 & 0x1ffff00000000) != 0x1000000000000) {
                  AssertCount = AssertCount + 1;
                  *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb8281b;
                  Throw::LogAssert();
                  *(undefined4 *)jsReentLock._24_8_ = 1;
                  *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82844;
                  bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                              ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                              "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                  if (!bVar9) goto LAB_00b82cef;
                  *(undefined4 *)jsReentLock._24_8_ = 0;
                }
              }
              else {
                *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb828ee;
                uVar14 = JavascriptConversion::ToUInt32_Full(pvVar17,pSVar2);
                pvVar17 = (Var)(ulong)uVar14;
              }
              *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb828f9;
              JsReentLock::MutateArrayObject((JsReentLock *)local_80);
              *(bool *)((long)local_80 + 0x108) = true;
              bVar9 = CARRY4((uint)pvVar17,(uint)args.super_Arguments.Values);
              args.super_Arguments.Values =
                   (Type)(ulong)((uint)pvVar17 + (uint)args.super_Arguments.Values);
              if (bVar9) {
                RVar8.fOverflow = true;
              }
            }
          }
          remoteTypeIds[uVar23] = TypeIds_Array;
          bVar9 = false;
          bVar7 = false;
        }
        else {
          if (bVar9 != false) {
            if (uVar23 == 0) {
              *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82664;
              BVar12 = JavascriptOperators::IsObject(pvVar17);
              if (BVar12 != 0) goto LAB_00b8266c;
LAB_00b828a8:
              bVar9 = false;
              bVar7 = false;
            }
            else {
LAB_00b8266c:
              dVar22 = (double)((ulong)pvVar17 & 0x1ffff00000000);
              if (dVar22 != 1.390671161567e-309 &&
                  ((ulong)pvVar17 & 0xffff000000000000) == 0x1000000000000) {
                AssertCount = AssertCount + 1;
                local_b8[0] = dVar22;
                *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb826b1;
                Throw::LogAssert();
                *(undefined4 *)jsReentLock._24_8_ = 1;
                *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb826da;
                bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                             ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                             "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar10) goto LAB_00b82cef;
                *(undefined4 *)jsReentLock._24_8_ = 0;
                dVar22 = local_b8[0];
              }
              if (((ulong)pvVar17 & 0xffff000000000000) == 0x1000000000000) {
                if (bVar7) {
                  if (dVar22 != 1.390671161567e-309) {
                    AssertCount = AssertCount + 1;
                    *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82720;
                    Throw::LogAssert();
                    *(undefined4 *)jsReentLock._24_8_ = 1;
                    *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82749;
                    bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                                 ,0x2a,
                                                 "((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                                 "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                    if (!bVar10) goto LAB_00b82cef;
                    *(undefined4 *)jsReentLock._24_8_ = 0;
                  }
                  if ((int)pvVar17 == -0x7fffe) {
                    bVar7 = false;
                  }
                }
              }
              else {
                if ((ulong)pvVar17 >> 0x32 == 0) goto LAB_00b828a8;
                if (bVar7) {
                  dVar22 = (double)((ulong)pvVar17 ^ 0xfffc000000000000);
                  bVar10 = true;
                  if (((double)(int)dVar22 == dVar22) && (!NAN((double)(int)dVar22) && !NAN(dVar22))
                     ) {
                    local_b8[1] = 0.0;
                    local_b8[0] = dVar22;
                    *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb8296f;
                    bVar10 = NumberUtilities::IsSpecial(dVar22,0x8000000000000000);
                    if (!bVar10) {
                      callInfo_local._4_4_ = (int)local_b8[0];
                    }
                  }
                  if (callInfo_local._4_4_ == -0x7fffe) {
                    bVar7 = false;
                  }
                  if (bVar10 != false) {
                    bVar7 = false;
                  }
                }
              }
            }
          }
          remoteTypeIds[uVar23] = TypeIds_Limit;
          uVar13 = (int)args.super_Arguments.Values + 1;
          args.super_Arguments.Values = (Type)(ulong)uVar13;
          if (uVar13 == 0) {
            RVar8.fOverflow = true;
          }
        }
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < (local_58._0_4_ & 0xffffff));
  }
  local_31.fOverflow = RVar8.fOverflow;
  if (local_31.fOverflow) {
    bVar9 = false;
    bVar7 = false;
  }
  uVar15 = 0xffffffff;
  if (!local_31.fOverflow) {
    uVar15 = (uint)args.super_Arguments.Values;
  }
  args.super_Arguments.Values = (Type)CONCAT44(args.super_Arguments.Values._4_4_,uVar15);
  *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82a00;
  pvVar17 = Arguments::operator[]((Arguments *)local_58,0);
  *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82a1c;
  pJVar19 = (JavascriptArray *)
            ArraySpeciesCreate<int>(pvVar17,0,pSVar2,(bool *)0x0,(bool *)0x0,(bool *)0x0);
  *(bool *)((long)local_80 + 0x108) = true;
  if (pJVar19 == (JavascriptArray *)0x0) {
    bVar10 = false;
  }
  else {
    *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82a37;
    bVar10 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar19);
    if (bVar10) {
      *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82a43;
      pJVar18 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar19);
    }
    else {
      pJVar18 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (pJVar18 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82a5b;
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(pJVar18);
    }
    if (bVar7) {
      *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82a69;
      bVar11 = VarIs<Js::JavascriptNativeIntArray,Js::RecyclableObject>((RecyclableObject *)pJVar19)
      ;
      bVar10 = true;
      if (!bVar11) {
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82a7b;
        bVar9 = VarIs<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                          ((RecyclableObject *)pJVar19);
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82a86;
        bVar10 = IsNonES5Array(pJVar19);
        bVar7 = false;
      }
    }
    else if (bVar9 == false) {
      *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82ab7;
      bVar10 = VarIs<Js::JavascriptNativeIntArray,Js::RecyclableObject>((RecyclableObject *)pJVar19)
      ;
      if (bVar10) {
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82ac3;
        pJVar21 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                            ((RecyclableObject *)pJVar19);
      }
      else {
        pJVar21 = (JavascriptNativeIntArray *)0x0;
      }
      if (pJVar21 == (JavascriptNativeIntArray *)0x0) {
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82b05;
        bVar10 = VarIs<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                           ((RecyclableObject *)pJVar19);
        if (bVar10) {
          *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82b11;
          fArray = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                             ((RecyclableObject *)pJVar19);
        }
        else {
          fArray = (JavascriptNativeFloatArray *)0x0;
        }
        if (fArray == (JavascriptNativeFloatArray *)0x0) {
          *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82b2e;
          bVar10 = IsNonES5Array(pJVar19);
        }
        else {
          bVar10 = true;
          *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82b24;
          JavascriptNativeFloatArray::ToVarArray(fArray);
        }
      }
      else {
        bVar10 = true;
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82ae6;
        JavascriptNativeIntArray::ToVarArray(pJVar21);
      }
    }
    else {
      *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82a9e;
      bVar10 = VarIs<Js::JavascriptNativeIntArray,Js::RecyclableObject>((RecyclableObject *)pJVar19)
      ;
      if (bVar10) {
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82aaa;
        pJVar21 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                            ((RecyclableObject *)pJVar19);
      }
      else {
        pJVar21 = (JavascriptNativeIntArray *)0x0;
      }
      if (pJVar21 == (JavascriptNativeIntArray *)0x0) {
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82af0;
        bVar9 = VarIs<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                          ((RecyclableObject *)pJVar19);
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82afb;
        bVar10 = IsNonES5Array(pJVar19);
      }
      else {
        bVar10 = true;
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82ad6;
        JavascriptNativeIntArray::ToNativeFloatArray(pJVar21);
      }
    }
  }
  if ((pJVar19 != (JavascriptArray *)0x0 & (bVar10 ^ 1U)) == 0) {
    uVar14 = (uint)args.super_Arguments.Values;
    if (bVar7) {
      if (bVar10 == false) {
        pJVar3 = (pSVar2->super_ScriptContextBase).javascriptLibrary;
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82bb0;
        pJVar19 = (JavascriptArray *)JavascriptLibrary::CreateNativeIntArray(pJVar3,uVar14);
      }
      else {
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82b51;
        pJVar19 = (JavascriptArray *)
                  VarTo<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                            ((RecyclableObject *)pJVar19);
      }
      if ((pJVar19->head).ptr == EmptySegment) {
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82bcb;
        AllocateHead<int>(pJVar19);
      }
      *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82beb;
      pJVar19 = ConcatIntArgs((JavascriptNativeIntArray *)pJVar19,remoteTypeIds,
                              (Arguments *)local_58,pSVar2);
      *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82bf7;
      JsReentLock::MutateArrayObject((JsReentLock *)local_80);
    }
    else if (bVar9 == false) {
      if (bVar10 == false) {
        pJVar3 = (pSVar2->super_ScriptContextBase).javascriptLibrary;
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82c6b;
        pJVar19 = JavascriptLibrary::CreateArray(pJVar3,uVar14);
      }
      else {
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82c08;
        pJVar19 = VarTo<Js::JavascriptArray,Js::RecyclableObject>((RecyclableObject *)pJVar19);
      }
      if ((pJVar19->head).ptr == EmptySegment) {
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82c86;
        AllocateHead<void*>(pJVar19);
      }
      *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82caa;
      ConcatArgsCallingHelper
                ((RecyclableObject *)pJVar19,remoteTypeIds,(Arguments *)local_58,pSVar2,&local_31);
      *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82cb3;
      JsReentLock::MutateArrayObject((JsReentLock *)local_80);
    }
    else {
      if (bVar10 == false) {
        pJVar3 = (pSVar2->super_ScriptContextBase).javascriptLibrary;
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82c16;
        pJVar19 = (JavascriptArray *)JavascriptLibrary::CreateNativeFloatArray(pJVar3,uVar14);
      }
      else {
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82ba2;
        pJVar19 = (JavascriptArray *)
                  VarTo<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                            ((RecyclableObject *)pJVar19);
      }
      if ((pJVar19->head).ptr == EmptySegment) {
        *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82c31;
        AllocateHead<double>(pJVar19);
      }
      *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82c51;
      pJVar19 = ConcatFloatArgs((JavascriptNativeFloatArray *)pJVar19,remoteTypeIds,
                                (Arguments *)local_58,pSVar2);
      *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82c5d;
      JsReentLock::MutateArrayObject((JsReentLock *)local_80);
    }
    *(bool *)((long)local_80 + 0x108) = true;
    p_Var4 = (pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
             super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74]
    ;
    *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82cca;
    (*p_Var4)(pJVar19);
  }
  else {
    *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82b77;
    ConcatArgsCallingHelper
              ((RecyclableObject *)pJVar19,remoteTypeIds,(Arguments *)local_58,pSVar2,&local_31);
    *(undefined8 *)((long)&puStack_c0 + lVar6) = 0xb82b80;
    JsReentLock::MutateArrayObject((JsReentLock *)local_80);
    *(bool *)((long)local_80 + 0x108) = true;
  }
  *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pJVar19;
}

Assistant:

Var JavascriptArray::EntryConcat(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Concat);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.concat"));
        }

        //
        // Compute the destination ScriptArray size:
        // - Each item, flattening only one level if a ScriptArray.
        //

        uint32 cDestLength = 0;
        JavascriptArray * pDestArray = NULL;

        PROBE_STACK_NO_DISPOSE(function->GetScriptContext(), Js::Constants::MinStackDefault + (args.Info.Count * sizeof(TypeId*)));
        TypeId* remoteTypeIds = (TypeId*)_alloca(args.Info.Count * sizeof(TypeId*));

        bool isInt = true;
        bool isFloat = true;
        ::Math::RecordOverflowPolicy destLengthOverflow;
        for (uint idxArg = 0; idxArg < args.Info.Count; idxArg++)
        {
            Var aItem = args[idxArg];
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(aItem);
#endif
            if (DynamicObject::IsAnyArray(aItem)) // Get JavascriptArray or ES5Array length
            {
                JavascriptArray * pItemArray = JavascriptArray::FromAnyArray(aItem);
                if (isFloat)
                {
                    if (!VarIs<JavascriptNativeIntArray>(pItemArray))
                    {
                        isInt = false;
                        if (!VarIs<JavascriptNativeFloatArray>(pItemArray))
                        {
                            isFloat = false;
                        }
                    }
                }
                cDestLength = UInt32Math::Add(cDestLength, pItemArray->GetLength(), destLengthOverflow);
            }
            else // Get remote array or object length
            {
                // We already checked for types derived from JavascriptArray. These are types that should behave like array
                // i.e. proxy to array and remote array.
                JS_REENTRANT(jsReentLock, BOOL isArray = JavascriptOperators::IsArray(aItem));
                if (isArray)
                {
                    // Don't try to preserve nativeness of remote arrays. The extra complexity is probably not
                    // worth it.
                    isInt = false;
                    isFloat = false;
                    if (!VarIs<JavascriptProxy>(aItem))
                    {
                        if (scriptContext->GetConfig()->IsES6ToLengthEnabled())
                        {
                            JS_REENTRANT(jsReentLock,
                                int64 len = JavascriptConversion::ToLength(JavascriptOperators::OP_GetLength(aItem, scriptContext), scriptContext));
                            // clipping to MaxArrayLength will overflow when added to cDestLength which we catch below
                            cDestLength = UInt32Math::Add(cDestLength, len < MaxArrayLength ? (uint32)len : MaxArrayLength, destLengthOverflow);
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock,
                                uint len = JavascriptConversion::ToUInt32(JavascriptOperators::OP_GetLength(aItem, scriptContext), scriptContext));
                            cDestLength = UInt32Math::Add(cDestLength, len, destLengthOverflow);
                        }
                    }
                    remoteTypeIds[idxArg] = TypeIds_Array; // Mark remote array, no matter remote JavascriptArray or ES5Array.
                }
                else
                {
                    if (isFloat)
                    {
                        if (BoxConcatItem(aItem, idxArg, scriptContext))
                        {
                            // A primitive will be boxed, so we have to create a var array for the result.
                            isInt = false;
                            isFloat = false;
                        }
                        else if (!TaggedInt::Is(aItem))
                        {
                            if (!JavascriptNumber::Is(aItem))
                            {
                                isInt = false;
                                isFloat = false;
                            }
                            else if (isInt)
                            {
                                int32 int32Value;
                                if(!JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(aItem), &int32Value) ||
                                    SparseArraySegment<int32>::IsMissingItem(&int32Value))
                                {
                                    isInt = false;
                                }
                            }
                        }
                        else if(isInt)
                        {
                            int32 int32Value = TaggedInt::ToInt32(aItem);
                            if(SparseArraySegment<int32>::IsMissingItem(&int32Value))
                            {
                                isInt = false;
                            }
                        }
                    }

                    remoteTypeIds[idxArg] = TypeIds_Limit;
                    cDestLength = UInt32Math::Add(cDestLength, 1, destLengthOverflow);
                }
            }
        }
        if (destLengthOverflow.HasOverflowed())
        {
            cDestLength = MaxArrayLength;
            isInt = false;
            isFloat = false;
        }

        //
        // Create the destination array
        //
        RecyclableObject* pDestObj = nullptr;
        bool isArray = false;

        JS_REENTRANT_NO_MUTATE(jsReentLock, pDestObj = ArraySpeciesCreate(args[0], 0, scriptContext));

        if (pDestObj)
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pDestObj);
#endif
            // Check the thing that species create made. If it's a native array that can't handle the source
            // data, convert it. If it's a more conservative kind of array than the source data, indicate that
            // so that the data will be converted on copy.
            if (isInt)
            {
                if (VarIs<JavascriptNativeIntArray>(pDestObj))
                {
                    isArray = true;
                }
                else
                {
                    isInt = false;
                    isFloat = VarIs<JavascriptNativeFloatArray>(pDestObj);
                    isArray = JavascriptArray::IsNonES5Array(pDestObj);
                }
            }
            else if (isFloat)
            {
                JavascriptNativeIntArray *nativeIntArray = JavascriptOperators::TryFromVar<JavascriptNativeIntArray>(pDestObj);
                if (nativeIntArray)
                {
                    JavascriptNativeIntArray::ToNativeFloatArray(nativeIntArray);
                    isArray = true;
                }
                else
                {
                    isFloat = VarIs<JavascriptNativeFloatArray>(pDestObj);
                    isArray = JavascriptArray::IsNonES5Array(pDestObj);
                }
            }
            else
            {
                JavascriptNativeIntArray *nativeIntArray = JavascriptOperators::TryFromVar<Js::JavascriptNativeIntArray>(pDestObj);
                if (nativeIntArray)
                {
                    JavascriptNativeIntArray::ToVarArray(nativeIntArray);
                    isArray = true;
                }
                else
                {
                    JavascriptNativeFloatArray *nativeFloatArray = JavascriptOperators::TryFromVar<Js::JavascriptNativeFloatArray>(pDestObj);
                    if (nativeFloatArray)
                    {
                        JavascriptNativeFloatArray::ToVarArray(nativeFloatArray);
                        isArray = true;
                    }
                    else
                    {
                        isArray = JavascriptArray::IsNonES5Array(pDestObj);
                    }
                }
            }
        }

        if (pDestObj == nullptr || isArray)
        {
            if (isInt)
            {
                JavascriptNativeIntArray *pIntArray = isArray ? VarTo<JavascriptNativeIntArray>(pDestObj) : scriptContext->GetLibrary()->CreateNativeIntArray(cDestLength);
                pIntArray->EnsureHead<int32>();

                JS_REENTRANT(jsReentLock, pDestArray = ConcatIntArgs(pIntArray, remoteTypeIds, args, scriptContext));
            }
            else if (isFloat)
            {
                JavascriptNativeFloatArray *pFArray = isArray ? VarTo<JavascriptNativeFloatArray>(pDestObj) : scriptContext->GetLibrary()->CreateNativeFloatArray(cDestLength);
                pFArray->EnsureHead<double>();

                JS_REENTRANT(jsReentLock, pDestArray = ConcatFloatArgs(pFArray, remoteTypeIds, args, scriptContext));
            }
            else
            {

                pDestArray = isArray ?  VarTo<JavascriptArray>(pDestObj) : scriptContext->GetLibrary()->CreateArray(cDestLength);
                // if the constructor has changed then we no longer specialize for ints and floats
                pDestArray->EnsureHead<Var>();

                JS_REENTRANT(jsReentLock, ConcatArgsCallingHelper(pDestArray, remoteTypeIds, args, scriptContext, destLengthOverflow));
            }

            //
            // Return the new array instance.
            //

#ifdef VALIDATE_ARRAY
            pDestArray->ValidateArray();
#endif

            return pDestArray;
        }

        Assert(pDestObj);
        JS_REENTRANT(jsReentLock, ConcatArgsCallingHelper(pDestObj, remoteTypeIds, args, scriptContext, destLengthOverflow));

        return pDestObj;
        JIT_HELPER_END(Array_Concat);
    }